

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

int mime_subparts_seek(void *instream,curl_off_t offset,int whence)

{
  int iVar1;
  int local_3c;
  int res;
  int result;
  curl_mimepart *part;
  curl_mime *mime;
  int whence_local;
  curl_off_t offset_local;
  void *instream_local;
  
  local_3c = 0;
  if ((whence == 0) && (offset == 0)) {
    if (*(int *)((long)instream + 0x50) == 0) {
      instream_local._4_4_ = 0;
    }
    else {
      for (_res = *(curl_mimepart **)((long)instream + 0x10); _res != (curl_mimepart *)0x0;
          _res = _res->nextpart) {
        iVar1 = mime_part_rewind(_res);
        if (iVar1 != 0) {
          local_3c = iVar1;
        }
      }
      if (local_3c == 0) {
        mimesetstate((mime_state *)((long)instream + 0x50),MIMESTATE_BEGIN,(void *)0x0);
      }
      instream_local._4_4_ = local_3c;
    }
  }
  else {
    instream_local._4_4_ = 2;
  }
  return instream_local._4_4_;
}

Assistant:

static int mime_subparts_seek(void *instream, curl_off_t offset, int whence)
{
  curl_mime *mime = (curl_mime *) instream;
  curl_mimepart *part;
  int result = CURL_SEEKFUNC_OK;

  if(whence != SEEK_SET || offset)
    return CURL_SEEKFUNC_CANTSEEK;    /* Only support full rewind. */

  if(mime->state.state == MIMESTATE_BEGIN)
   return CURL_SEEKFUNC_OK;           /* Already rewound. */

  for(part = mime->firstpart; part; part = part->nextpart) {
    int res = mime_part_rewind(part);
    if(res != CURL_SEEKFUNC_OK)
      result = res;
  }

  if(result == CURL_SEEKFUNC_OK)
    mimesetstate(&mime->state, MIMESTATE_BEGIN, NULL);

  return result;
}